

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

void tcdptf(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  char buf [256];
  undefined8 local_1d8;
  void **local_1d0;
  undefined1 *local_1c8;
  undefined1 local_1b8 [8];
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  char local_108 [256];
  
  local_1c8 = local_1b8;
  if (in_AL != '\0') {
    local_188 = in_XMM0_Qa;
    local_178 = in_XMM1_Qa;
    local_168 = in_XMM2_Qa;
    local_158 = in_XMM3_Qa;
    local_148 = in_XMM4_Qa;
    local_138 = in_XMM5_Qa;
    local_128 = in_XMM6_Qa;
    local_118 = in_XMM7_Qa;
  }
  local_1d0 = &va[0].overflow_arg_area;
  local_1d8 = 0x3000000008;
  local_1b0 = in_RSI;
  local_1a8 = in_RDX;
  local_1a0 = in_RCX;
  local_198 = in_R8;
  local_190 = in_R9;
  vsprintf(local_108,fmt,&local_1d8);
  os_printz(local_108);
  return;
}

Assistant:

static void tcdptf(const char *fmt, ...)
{
    char buf[256];
    va_list va;

    /* format the string */
    va_start(va, fmt);
    vsprintf(buf, fmt, va);
    va_end(va);

    /* print the formatted buffer */
    os_printz(buf);
}